

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallt(char *name,metacall_value_id *ids,...)

{
  char in_AL;
  type_id tVar1;
  metacall_value_id id;
  loader_data v;
  function func;
  signature s;
  size_t size;
  type t;
  char *pcVar2;
  value pvVar3;
  undefined8 *puVar4;
  size_t length;
  function_return pvVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar7;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  void *args [16];
  undefined8 local_188;
  undefined8 *local_180;
  void *local_168 [16];
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  v = loader_get(name);
  tVar1 = value_type_id(v);
  if ((tVar1 == 0xd) && (func = value_to_function(v), func != (function)0x0)) {
    s = function_signature(func);
    size = signature_count(s);
    local_180 = (undefined8 *)&stack0x00000008;
    local_188 = &DAT_3000000010;
    if (size == 0) {
      pvVar5 = function_call(func,local_168,0);
    }
    else {
      sVar7 = 0;
      do {
        t = signature_get_type(s,sVar7);
        type_index(t);
        if (t == (type)0x0) {
          id = ids[sVar7];
        }
        else {
          id = type_index(t);
        }
        switch(id) {
        case METACALL_BOOL:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_bool('\0');
          local_168[sVar7] = pvVar3;
        default:
          pcVar2 = type_id_name(id);
          log_write_impl_va("metacall",0x2e6,"metacallt",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                            ,LOG_LEVEL_ERROR,
                            "Calling metacallt with unsupported type \'%s\', using null type instead"
                            ,pcVar2);
          pvVar3 = metacall_value_create_null();
          break;
        case METACALL_CHAR:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_char('\0');
          break;
        case METACALL_SHORT:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_short(0);
          break;
        case METACALL_INT:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_int(0);
          break;
        case METACALL_LONG:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_long(0x125c8d);
          break;
        case METACALL_FLOAT:
          if (local_188._4_4_ < 0xa1) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_ + 0x10,(uint)local_188);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_float(0.0);
          break;
        case METACALL_DOUBLE:
          if (local_188._4_4_ < 0xa1) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_ + 0x10,(uint)local_188);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_double(5.94487452752355e-318);
          break;
        case METACALL_STRING:
          uVar6 = (ulong)local_188 & 0xffffffff;
          if (uVar6 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
            puVar4 = (undefined8 *)((long)local_e8 + uVar6);
          }
          else {
            puVar4 = local_180;
            local_180 = local_180 + 1;
          }
          pcVar2 = (char *)*puVar4;
          length = strlen(pcVar2);
          pvVar3 = value_create_string(pcVar2,length);
          break;
        case METACALL_PTR:
          if ((uint)local_188 < 0x29) {
            local_188 = (undefined1 *)CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar3 = value_create_ptr((void *)0x125ca5);
        }
        local_168[sVar7] = pvVar3;
        sVar7 = sVar7 + 1;
      } while (size != sVar7);
      pvVar5 = function_call(func,local_168,size);
      sVar7 = 0;
      do {
        value_type_destroy(local_168[sVar7]);
        sVar7 = sVar7 + 1;
      } while (size != sVar7);
    }
  }
  else {
    pvVar5 = (function_return)0x0;
  }
  return pvVar5;
}

Assistant:

void *metacallt(const char *name, const enum metacall_value_id ids[], ...)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		value ret = NULL;

		signature s = function_signature(f);

		size_t iterator, args_count = signature_count(s);

		va_list va;

		va_start(va, ids);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			type t = signature_get_type(s, iterator);

			type_id id = type_index(t);

			if (t != NULL)
			{
				id = type_index(t);
			}
			else
			{
				id = ids[iterator];
			}

			if (id == TYPE_BOOL)
			{
				args[iterator] = value_create_bool((boolean)va_arg(va, unsigned int));
			}
			if (id == TYPE_CHAR)
			{
				args[iterator] = value_create_char((char)va_arg(va, int));
			}
			else if (id == TYPE_SHORT)
			{
				args[iterator] = value_create_short((short)va_arg(va, int));
			}
			else if (id == TYPE_INT)
			{
				args[iterator] = value_create_int(va_arg(va, int));
			}
			else if (id == TYPE_LONG)
			{
				args[iterator] = value_create_long(va_arg(va, long));
			}
			else if (id == TYPE_FLOAT)
			{
				args[iterator] = value_create_float((float)va_arg(va, double));
			}
			else if (id == TYPE_DOUBLE)
			{
				args[iterator] = value_create_double(va_arg(va, double));
			}
			else if (id == TYPE_STRING)
			{
				const char *str = va_arg(va, const char *);

				args[iterator] = value_create_string(str, strlen(str));
			}
			else if (id == TYPE_PTR)
			{
				args[iterator] = value_create_ptr(va_arg(va, const void *));
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Calling metacallt with unsupported type '%s', using null type instead", type_id_name(id));
				args[iterator] = metacall_value_create_null();
			}
		}

		va_end(va);

		ret = function_call(f, args, args_count);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			value_type_destroy(args[iterator]);
		}

		return ret;
	}

	return NULL;
}